

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::ConvolutionDepthWise_x86_avx2::forward_int8_x86
          (ConvolutionDepthWise_x86_avx2 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  undefined4 uVar2;
  int *piVar3;
  Layer *pLVar4;
  undefined1 uVar5;
  undefined3 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [32];
  int iVar10;
  void *pvVar11;
  undefined1 uVar12;
  uint uVar13;
  _func_int *p_Var14;
  _func_int **pp_Var15;
  int iVar16;
  undefined4 *puVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  float fVar22;
  iterator iVar23;
  pointer pfVar24;
  int iVar25;
  Option *_elemsize;
  undefined1 (*pauVar26) [16];
  uint _elempack;
  Option *opt_00;
  long lVar27;
  size_t sVar28;
  int iVar29;
  undefined1 (*pauVar30) [16];
  void *pvVar31;
  ulong uVar32;
  long lVar33;
  int iVar34;
  ulong uVar35;
  bool bVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  __m128 max;
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [64];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  v4sf one;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar157;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar165;
  undefined1 auVar164 [16];
  float fVar166;
  Option opt_q;
  float top_rescale;
  float scale_out;
  Option opt_g;
  float *local_350;
  undefined1 local_348 [40];
  undefined8 uStack_320;
  undefined8 uStack_318;
  int iStack_310;
  undefined4 uStack_30c;
  size_t local_308;
  ulong local_300;
  float *local_2f8;
  _func_int **local_2f0;
  Mat local_2e8;
  ulong local_298;
  void *local_290;
  Mat local_288;
  long local_238;
  ulong local_230;
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  pointer local_200;
  int *local_1f8;
  Allocator *local_1f0;
  int local_1e8;
  Allocator *local_1e0;
  undefined4 local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  int local_1c8;
  ulong local_1c0;
  undefined1 local_1b8 [16];
  void *local_1a0;
  int *local_198;
  ulong local_190;
  int local_188;
  Allocator *local_180;
  undefined4 local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  ulong local_160;
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  size_type local_130;
  Mat local_128;
  vector<float,_std::allocator<float>_> local_d8;
  vector<float,_std::allocator<float>_> local_c0;
  vector<float,_std::allocator<float>_> local_a8;
  vector<float,_std::allocator<float>_> local_90;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *pAStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  local_128.c = bottom_blob->c;
  local_128.elempack = bottom_blob->elempack;
  local_128.elemsize = bottom_blob->elemsize;
  pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx2;
  p_Var14 = pp_Var15[-3];
  iVar16 = *(int *)(&this->field_0xd4 + (long)p_Var14);
  iVar29 = *(int *)(&this->field_0xd8 + (long)p_Var14);
  iVar21 = *(int *)(&this->field_0xdc + (long)p_Var14);
  iVar34 = *(int *)(&this->field_0xe0 + (long)p_Var14);
  piVar3 = bottom_blob->refcount;
  local_128.data = bottom_blob->data;
  local_128.refcount = bottom_blob->refcount;
  local_128.allocator = bottom_blob->allocator;
  local_128.dims = bottom_blob->dims;
  local_128.w = bottom_blob->w;
  local_128.h = bottom_blob->h;
  local_128.d = bottom_blob->d;
  local_128.cstep = bottom_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
    pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx2;
  }
  if (local_128.elempack == 0 || ((int)local_128.elemsize * 8) / local_128.elempack != 8) {
    uVar35 = (long)(local_128.elempack * local_128.c) /
             (long)*(int *)(&this->field_0x108 + (long)pp_Var15[-3]);
    local_288.cstep = 0;
    local_288.data = (undefined4 *)0x0;
    local_288.refcount._0_4_ = 0;
    local_288.refcount._4_4_ = 0;
    local_288.elemsize = 0;
    local_288.elempack = 0;
    local_288.allocator = (Allocator *)0x0;
    local_288.dims = 0;
    local_288.w = 0;
    local_288.h = 0;
    local_288.d = 0;
    local_288.c = 0;
    Mat::create(&local_288,local_128.elempack * local_128.c,4,(Allocator *)0x0);
    pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx2;
    p_Var14 = pp_Var15[-3];
    if (0 < *(int *)(&this->field_0x108 + (long)p_Var14)) {
      lVar27 = 0;
      puVar17 = (undefined4 *)local_288.data;
      do {
        if (0 < (int)uVar35) {
          uVar2 = *(undefined4 *)(*(long *)(&this->field_0x240 + (long)p_Var14) + lVar27 * 4);
          uVar32 = uVar35 & 0xffffffff;
          do {
            *puVar17 = uVar2;
            puVar17 = puVar17 + 1;
            uVar20 = (int)uVar32 - 1;
            uVar32 = (ulong)uVar20;
          } while (uVar20 != 0);
          p_Var14 = pp_Var15[-3];
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 < *(int *)(&this->field_0x108 + (long)p_Var14));
    }
    uVar5 = opt->lightmode;
    uVar6 = *(undefined3 *)&opt->field_0x1;
    uVar7 = opt->num_threads;
    local_348._4_4_ = uVar7;
    local_348._1_3_ = uVar6;
    local_348[0] = uVar5;
    local_348._16_8_ = opt->workspace_allocator;
    local_348._24_4_ = opt->openmp_blocktime;
    local_348[0x1c] = opt->use_winograd_convolution;
    local_348[0x1d] = opt->use_sgemm_convolution;
    local_348[0x1e] = opt->use_int8_inference;
    local_348[0x1f] = opt->use_vulkan_compute;
    local_348[0x20] = opt->use_bf16_storage;
    local_348[0x21] = opt->use_fp16_packed;
    local_348[0x22] = opt->use_fp16_storage;
    local_348[0x23] = opt->use_fp16_arithmetic;
    local_348[0x24] = opt->use_int8_packed;
    local_348[0x25] = opt->use_int8_storage;
    local_348[0x26] = opt->use_int8_arithmetic;
    local_348[0x27] = opt->use_packing_layout;
    unique0x00006d08 = opt->use_shader_pack8;
    unique0x00006d09 = opt->use_subgroup_basic;
    unique0x00006d0a = opt->use_subgroup_vote;
    unique0x00006d0b = opt->use_subgroup_ballot;
    unique0x00006d0c = opt->use_subgroup_shuffle;
    unique0x00006d0d = opt->use_image_storage;
    unique0x00006d0e = opt->use_tensor_storage;
    unique0x00006d0f = opt->use_weight_fp16_storage;
    uStack_318._0_4_ = opt->flush_denormals;
    unique0x00006d14 = opt->use_local_pool_allocator;
    unique0x00006d15 = opt->use_reserved_1;
    unique0x00006d16 = opt->use_reserved_2;
    unique0x00006d17 = opt->use_reserved_3;
    unique0x00006d18 = opt->use_reserved_4;
    unique0x00006d19 = opt->use_reserved_5;
    unique0x00006d1a = opt->use_reserved_6;
    unique0x00006d1b = opt->use_reserved_7;
    unique0x00006d1c = opt->use_reserved_8;
    unique0x00006d1d = opt->use_reserved_9;
    unique0x00006d1e = opt->use_reserved_10;
    unique0x00006d1f = opt->use_reserved_11;
    local_348._8_8_ = opt->workspace_allocator;
    quantize_to_int8(bottom_blob,&local_128,&local_288,(Option *)local_348);
    piVar3 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (local_288.allocator == (Allocator *)0x0) {
          if ((undefined4 *)local_288.data != (undefined4 *)0x0) {
            free(local_288.data);
          }
        }
        else {
          (*(local_288.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx2;
  }
  local_288.cstep = 0;
  local_288.data = (void *)0x0;
  local_288.refcount._0_4_ = 0;
  local_288.refcount._4_4_ = 0;
  local_288.elemsize = 0;
  local_288.elempack = 0;
  local_288.allocator = (Allocator *)0x0;
  local_288.dims = 0;
  local_288.w = 0;
  local_288.h = 0;
  local_288.d = 0;
  local_288.c = 0;
  ConvolutionDepthWise::make_padding
            ((ConvolutionDepthWise *)
             ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 + (long)pp_Var15[-3]),&local_128,
             &local_288,opt);
  iVar10 = local_288.w;
  iVar19 = local_288.elempack;
  iVar18 = -100;
  if ((local_288.data == (void *)0x0) || (local_288.cstep * (long)local_288.c == 0))
  goto LAB_0028365a;
  p_Var14 = this->_vptr_ConvolutionDepthWise_x86_avx2[-3];
  iVar16 = (~((iVar16 + -1) * iVar21) + local_288.w) / *(int *)(&this->field_0xe4 + (long)p_Var14);
  iVar21 = iVar16 + 1;
  uVar35 = (long)(~((iVar29 + -1) * iVar34) + local_288.h) /
           (long)*(int *)(&this->field_0xe8 + (long)p_Var14);
  local_298 = uVar35 & 0xffffffff;
  iVar29 = (int)uVar35 + 1;
  uVar20 = local_288.elempack * local_288.c;
  if ((uVar20 == *(uint *)(&this->field_0x108 + (long)p_Var14)) &&
     (uVar20 - *(int *)(&this->field_0xd0 + (long)p_Var14) == 0)) {
    local_1b8._0_8_ = (long)local_288.c;
    uVar13 = 8;
    if (opt->use_packing_layout == false) {
      uVar13 = 1;
    }
    if ((uVar20 & 7) != 0) {
      uVar13 = 1;
    }
    opt_00 = (Option *)(ulong)uVar13;
    iVar34 = *(int *)(&this->field_0x10c + (long)p_Var14);
    _elemsize = (Option *)(ulong)(uVar13 * 4);
    if (100 < iVar34) {
      _elemsize = opt_00;
    }
    Mat::create(top_blob,iVar21,iVar29,(int)uVar20 / (int)uVar13,(size_t)_elemsize,uVar13,
                opt->blob_allocator);
    iVar18 = -100;
    if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
    goto LAB_0028365a;
    iVar18 = 0;
    if (iVar19 == 1) {
      pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx2;
      p_Var14 = pp_Var15[-3];
      iVar29 = *(int *)(&this->field_0xd8 + (long)p_Var14);
      if (iVar29 == 3 && *(int *)(&this->field_0xd4 + (long)p_Var14) == 3) {
        if ((((*(int *)(&this->field_0xe4 + (long)p_Var14) == 1) &&
             (*(int *)(&this->field_0xe8 + (long)p_Var14) == 1)) &&
            (*(int *)(&this->field_0xdc + (long)p_Var14) == 1)) &&
           ((*(int *)(&this->field_0xe0 + (long)p_Var14) == 1 &&
            (*(uint *)(&this->field_0x110 + (long)p_Var14) < 2)))) {
          if (iVar34 < 0x65) {
            local_348._0_16_ = (undefined1  [16])0x0;
            local_348._16_8_ = (Allocator *)0x0;
            p_Var14 = (_func_int *)
                      ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 + (long)pp_Var15[-3]);
            if (0 < *(int *)(&this->field_0x108 + (long)pp_Var15[-3])) {
              lVar27 = 0;
              do {
                fVar22 = 1.0 / (*(float *)(*(long *)(p_Var14 + 0x1f8) + lVar27 * 4) *
                               *(float *)(*(long *)(p_Var14 + 0x240) + lVar27 * 4));
                local_2e8.data = (void *)CONCAT44(local_2e8.data._4_4_,fVar22);
                if (local_348._8_8_ == local_348._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_348,
                             (iterator)local_348._8_8_,(float *)&local_2e8);
                  pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx2;
                }
                else {
                  *(float *)local_348._8_8_ = fVar22;
                  local_348._8_8_ = (float *)(local_348._8_8_ + 4);
                }
                lVar27 = lVar27 + 1;
                p_Var14 = (_func_int *)
                          ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 + (long)pp_Var15[-3]);
              } while (lVar27 < *(int *)(&this->field_0x108 + (long)pp_Var15[-3]));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_a8,(vector<float,_std::allocator<float>_> *)local_348);
            convdw3x3s1_int8_dequant_sse
                      (&local_288,top_blob,*(Mat **)(p_Var14 + 0x168),*(Mat **)(p_Var14 + 0x1b0),
                       &local_a8,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
          else {
            local_348._0_16_ = (undefined1  [16])0x0;
            local_348._16_8_ = (Allocator *)0x0;
            p_Var14 = (_func_int *)
                      ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 + (long)pp_Var15[-3]);
            if (0 < *(int *)(&this->field_0x108 + (long)pp_Var15[-3])) {
              lVar27 = 0;
              do {
                fVar22 = *(float *)(*(long *)(p_Var14 + 0x1f8) + lVar27 * 4);
                fVar37 = 0.0;
                if (fVar22 != 0.0) {
                  fVar37 = 1.0 / (fVar22 * *(float *)(*(long *)(p_Var14 + 0x240) + lVar27 * 4));
                }
                local_2e8.data = (void *)CONCAT44(local_2e8.data._4_4_,fVar37);
                local_200 = (pointer)CONCAT44(local_200._4_4_,
                                              *(undefined4 *)
                                               (*(long *)(p_Var14 + 0x288) + lVar27 * 4));
                if (local_348._8_8_ == local_348._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_348,
                             (iterator)local_348._8_8_,(float *)&local_2e8);
                  iVar23._M_current = (float *)local_348._8_8_;
                }
                else {
                  *(float *)local_348._8_8_ = fVar37;
                  iVar23._M_current = (float *)(local_348._8_8_ + 4);
                  local_348._8_8_ = iVar23._M_current;
                }
                if (iVar23._M_current == (float *)local_348._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_348,iVar23,
                             (float *)&local_200);
                }
                else {
                  *iVar23._M_current = local_200._0_4_;
                  local_348._8_8_ = iVar23._M_current + 1;
                }
                lVar27 = lVar27 + 1;
                p_Var14 = (_func_int *)
                          ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 +
                          (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
              } while (lVar27 < *(int *)(&this->field_0x108 +
                                        (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_90,(vector<float,_std::allocator<float>_> *)local_348);
            convdw3x3s1_int8_requant_sse
                      (&local_288,top_blob,*(Mat **)(p_Var14 + 0x168),*(Mat **)(p_Var14 + 0x1b0),
                       &local_90,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_90.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
        }
        else {
          iVar29 = 3;
          if ((((*(int *)(&this->field_0xdc + (long)p_Var14) != 1) ||
               ((*(int *)(&this->field_0xe0 + (long)p_Var14) != 1 ||
                (*(int *)(&this->field_0xe4 + (long)p_Var14) != 2)))) ||
              (*(int *)(&this->field_0xe8 + (long)p_Var14) != 2)) ||
             (1 < *(uint *)(&this->field_0x110 + (long)p_Var14))) goto LAB_002830b7;
          if (iVar34 < 0x65) {
            local_348._0_16_ = (undefined1  [16])0x0;
            local_348._16_8_ = (Allocator *)0x0;
            p_Var14 = (_func_int *)
                      ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 + (long)pp_Var15[-3]);
            if (0 < *(int *)(&this->field_0x108 + (long)pp_Var15[-3])) {
              lVar27 = 0;
              do {
                fVar22 = 1.0 / (*(float *)(*(long *)(p_Var14 + 0x1f8) + lVar27 * 4) *
                               *(float *)(*(long *)(p_Var14 + 0x240) + lVar27 * 4));
                local_2e8.data = (void *)CONCAT44(local_2e8.data._4_4_,fVar22);
                if (local_348._8_8_ == local_348._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_348,
                             (iterator)local_348._8_8_,(float *)&local_2e8);
                  pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx2;
                }
                else {
                  *(float *)local_348._8_8_ = fVar22;
                  local_348._8_8_ = (float *)(local_348._8_8_ + 4);
                }
                lVar27 = lVar27 + 1;
                p_Var14 = (_func_int *)
                          ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 + (long)pp_Var15[-3]);
              } while (lVar27 < *(int *)(&this->field_0x108 + (long)pp_Var15[-3]));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_d8,(vector<float,_std::allocator<float>_> *)local_348);
            convdw3x3s2_int8_dequant_sse
                      (&local_288,top_blob,*(Mat **)(p_Var14 + 0x168),*(Mat **)(p_Var14 + 0x1b0),
                       &local_d8,opt_00);
          }
          else {
            local_348._0_16_ = (undefined1  [16])0x0;
            local_348._16_8_ = (Allocator *)0x0;
            p_Var14 = (_func_int *)
                      ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 + (long)pp_Var15[-3]);
            if (0 < *(int *)(&this->field_0x108 + (long)pp_Var15[-3])) {
              lVar27 = 0;
              do {
                fVar22 = *(float *)(*(long *)(p_Var14 + 0x1f8) + lVar27 * 4);
                fVar37 = 0.0;
                if (fVar22 != 0.0) {
                  fVar37 = 1.0 / (fVar22 * *(float *)(*(long *)(p_Var14 + 0x240) + lVar27 * 4));
                }
                local_2e8.data = (void *)CONCAT44(local_2e8.data._4_4_,fVar37);
                local_200 = (pointer)CONCAT44(local_200._4_4_,
                                              *(undefined4 *)
                                               (*(long *)(p_Var14 + 0x288) + lVar27 * 4));
                if (local_348._8_8_ == local_348._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_348,
                             (iterator)local_348._8_8_,(float *)&local_2e8);
                  iVar23._M_current = (float *)local_348._8_8_;
                }
                else {
                  *(float *)local_348._8_8_ = fVar37;
                  iVar23._M_current = (float *)(local_348._8_8_ + 4);
                  local_348._8_8_ = iVar23._M_current;
                }
                if (iVar23._M_current == (float *)local_348._16_8_) {
                  std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                            ((vector<float,std::allocator<float>> *)local_348,iVar23,
                             (float *)&local_200);
                }
                else {
                  *iVar23._M_current = local_200._0_4_;
                  local_348._8_8_ = iVar23._M_current + 1;
                }
                lVar27 = lVar27 + 1;
                p_Var14 = (_func_int *)
                          ((long)&this->_vptr_ConvolutionDepthWise_x86_avx2 +
                          (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
              } while (lVar27 < *(int *)(&this->field_0x108 +
                                        (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
            }
            std::vector<float,_std::allocator<float>_>::vector
                      (&local_c0,(vector<float,_std::allocator<float>_> *)local_348);
            convdw3x3s2_int8_requant_sse
                      (&local_288,top_blob,*(Mat **)(p_Var14 + 0x168),*(Mat **)(p_Var14 + 0x1b0),
                       &local_c0,opt_00);
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start =
                 local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_start;
            local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
          }
        }
        if (local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_d8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        if ((pointer)local_348._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_348._0_8_,local_348._16_8_ - local_348._0_8_);
        }
        pLVar4 = this->activation;
        if (pLVar4 != (Layer *)0x0) {
          (*pLVar4->_vptr_Layer[9])(pLVar4,top_blob,opt);
          iVar18 = 0;
          goto LAB_0028365a;
        }
      }
      else {
LAB_002830b7:
        iVar29 = iVar29 * *(int *)(&this->field_0xd4 + (long)p_Var14);
        local_300 = CONCAT44(local_300._4_4_,iVar29);
        local_130 = (size_type)iVar29;
        std::vector<int,_std::allocator<int>_>::vector
                  ((vector<int,_std::allocator<int>_> *)local_348,local_130,
                   (allocator_type *)&local_2e8);
        uVar8 = local_348._0_8_;
        pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx2;
        p_Var14 = pp_Var15[-3];
        if (0 < *(int *)(&this->field_0xd8 + (long)p_Var14)) {
          iVar29 = *(int *)(&this->field_0xe0 + (long)p_Var14);
          iVar21 = *(int *)(&this->field_0xdc + (long)p_Var14);
          iVar19 = *(int *)(&this->field_0xd4 + (long)p_Var14);
          iVar18 = 0;
          fVar22 = 0.0;
          iVar25 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var14)) {
              lVar27 = 0;
              do {
                *(float *)(local_348._0_8_ + (iVar25 + lVar27) * 4) = fVar22;
                p_Var14 = pp_Var15[-3];
                fVar22 = (float)((int)fVar22 + *(int *)(&this->field_0xdc + (long)p_Var14));
                lVar27 = lVar27 + 1;
              } while ((int)lVar27 < *(int *)(&this->field_0xd4 + (long)p_Var14));
              iVar25 = iVar25 + (int)lVar27;
            }
            fVar22 = (float)((int)fVar22 + (iVar10 * iVar29 - iVar21 * iVar19));
            iVar18 = iVar18 + 1;
          } while (iVar18 < *(int *)(&this->field_0xd8 + (long)p_Var14));
        }
        if (0 < *(int *)(&this->field_0x108 + (long)p_Var14)) {
          uVar35 = local_300 & 0xffffffff;
          local_1b8._8_4_ = 0x80000000;
          local_1b8._0_8_ = 0x8000000080000000;
          local_1b8._12_4_ = 0x80000000;
          auVar55 = ZEXT1664(local_1b8);
          local_148._8_4_ = 0x3effffff;
          local_148._0_8_ = 0x3effffff3effffff;
          local_148._12_4_ = 0x3effffff;
          local_238 = 0;
          lVar27 = 0;
          iVar29 = (int)local_300;
          local_2f0 = pp_Var15;
          do {
            if (-1 < (int)local_298) {
              pvVar31 = (void *)(local_288.cstep * lVar27 * local_288.elemsize +
                                (long)local_288.data);
              local_350 = (float *)(top_blob->cstep * lVar27 * top_blob->elemsize +
                                   (long)top_blob->data);
              local_228._0_8_ = (long)local_288.w * local_288.elemsize;
              lVar33 = *(long *)(&this->field_0x168 + (long)p_Var14) + local_238;
              local_230 = 0;
              local_2f8 = local_350;
              local_290 = pvVar31;
              do {
                if (-1 < iVar16) {
                  local_218._0_8_ = (long)(int)local_230;
                  iVar21 = 0;
                  do {
                    p_Var14 = pp_Var15[-3];
                    fVar22 = 0.0;
                    fVar37 = 0.0;
                    if (0 < iVar29) {
                      uVar32 = 0;
                      iVar19 = 0;
                      do {
                        iVar19 = iVar19 + (int)*(char *)(lVar33 + uVar32) *
                                          (int)*(char *)((long)pvVar31 +
                                                        (long)(int)*(pointer)(uVar8 + uVar32 * 4) +
                                                        (long)*(int *)(&this->field_0xe8 +
                                                                      (long)p_Var14) *
                                                        local_218._0_8_ * local_228._0_8_ +
                                                        (long)iVar21 *
                                                        (long)*(int *)(&this->field_0xe4 +
                                                                      (long)p_Var14));
                        uVar32 = uVar32 + 1;
                      } while (uVar35 != uVar32);
                      fVar37 = (float)iVar19;
                    }
                    fVar157 = *(float *)(*(long *)(&this->field_0x1f8 + (long)p_Var14) + lVar27 * 4)
                    ;
                    if (fVar157 != 0.0) {
                      fVar22 = 1.0 / (fVar157 *
                                     *(float *)(*(long *)(&this->field_0x240 + (long)p_Var14) +
                                               lVar27 * 4));
                    }
                    fVar22 = fVar22 * fVar37;
                    if (*(int *)(&this->field_0x100 + (long)p_Var14) != 0) {
                      fVar22 = fVar22 + *(float *)(*(long *)(&this->field_0x1b0 + (long)p_Var14) +
                                                  lVar27 * 4);
                    }
                    auVar57 = ZEXT416((uint)fVar22);
                    fVar37 = fVar22;
                    switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var14)) {
                    case 1:
                      auVar57 = vmaxss_avx(auVar57,ZEXT416(0));
                      fVar37 = auVar57._0_4_;
                      break;
                    case 2:
                      auVar57 = vcmpss_avx(ZEXT816(0) << 0x20,auVar57,1);
                      auVar81._8_4_ = 0x3f800000;
                      auVar81._0_8_ = 0x3f8000003f800000;
                      auVar81._12_4_ = 0x3f800000;
                      auVar57 = vblendvps_avx(ZEXT416(**(uint **)(&this->field_0x118 + (long)p_Var14
                                                                 )),auVar81,auVar57);
                      fVar37 = auVar57._0_4_ * fVar22;
                      break;
                    case 3:
                      auVar57 = vmaxss_avx(auVar57,ZEXT416(**(uint **)(&this->field_0x118 +
                                                                      (long)p_Var14)));
                      auVar57 = vminss_avx(auVar57,ZEXT416((*(uint **)(&this->field_0x118 +
                                                                      (long)p_Var14))[1]));
                      fVar37 = auVar57._0_4_;
                      break;
                    case 4:
                      fVar22 = expf((float)((uint)fVar22 ^ auVar55._0_4_));
                      auVar55 = ZEXT1664(local_1b8);
                      pp_Var15 = local_2f0;
                      pvVar31 = local_290;
                      iVar29 = (int)local_300;
                      fVar37 = 1.0 / (fVar22 + 1.0);
                      break;
                    case 5:
                      local_158 = auVar57;
                      fVar22 = expf(fVar22);
                      fVar22 = logf(fVar22 + 1.0);
                      fVar22 = tanhf(fVar22);
                      auVar55 = ZEXT1664(local_1b8);
                      pp_Var15 = local_2f0;
                      pvVar31 = local_290;
                      iVar29 = (int)local_300;
                      fVar37 = fVar22 * (float)local_158._0_4_;
                      break;
                    case 6:
                      fVar157 = **(float **)(&this->field_0x118 + (long)p_Var14);
                      fVar165 = (*(float **)(&this->field_0x118 + (long)p_Var14))[1];
                      fVar72 = (float)((uint)fVar165 ^ auVar55._0_4_) / fVar157;
                      fVar37 = 0.0;
                      if ((fVar72 <= fVar22) && (fVar37 = fVar22, fVar22 <= fVar72 + 1.0 / fVar157))
                      {
                        auVar57 = vfmadd213ss_fma(ZEXT416((uint)fVar157),auVar57,
                                                  ZEXT416((uint)fVar165));
                        fVar37 = auVar57._0_4_ * fVar22;
                      }
                    }
                    if (iVar34 < 0x65) {
                      *local_2f8 = fVar37;
                      local_2f8 = local_2f8 + 1;
                    }
                    else {
                      fVar37 = fVar37 * *(float *)(*(long *)(&this->field_0x288 + (long)p_Var14) +
                                                  lVar27 * 4);
                      auVar57 = vandps_avx(ZEXT416((uint)fVar37),auVar55._0_16_);
                      auVar57 = vorps_avx(auVar57,local_148);
                      auVar57 = ZEXT416((uint)(fVar37 + auVar57._0_4_));
                      auVar57 = vroundss_avx(auVar57,auVar57,0xb);
                      iVar19 = (int)auVar57._0_4_;
                      if (iVar19 < -0x7e) {
                        iVar19 = -0x7f;
                      }
                      uVar12 = (undefined1)iVar19;
                      if (0x7e < iVar19) {
                        uVar12 = 0x7f;
                      }
                      *(undefined1 *)local_350 = uVar12;
                      local_350 = (float *)((long)local_350 + 1);
                    }
                    bVar36 = iVar21 != iVar16;
                    iVar21 = iVar21 + 1;
                  } while (bVar36);
                }
                iVar21 = (int)local_230;
                local_230 = (ulong)(iVar21 + 1);
              } while (iVar21 != (int)local_298);
            }
            p_Var14 = pp_Var15[-3];
            lVar27 = lVar27 + 1;
            local_238 = local_238 + local_130;
          } while (lVar27 < *(int *)(&this->field_0x108 + (long)p_Var14));
        }
        if ((pointer)local_348._0_8_ != (pointer)0x0) {
          uVar35 = local_348._16_8_ - local_348._0_8_;
          pfVar24 = (pointer)local_348._0_8_;
          goto LAB_00283569;
        }
      }
    }
    else {
      if (iVar19 != 8) goto LAB_0028365a;
      uVar35 = (long)*(int *)(&this->field_0xd8 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) *
               (long)*(int *)(&this->field_0xd4 +
                             (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_348,uVar35,(allocator_type *)&local_2e8)
      ;
      pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx2;
      p_Var14 = pp_Var15[-3];
      if (0 < *(int *)(&this->field_0xd8 + (long)p_Var14)) {
        iVar29 = *(int *)(&this->field_0xe0 + (long)p_Var14);
        iVar21 = *(int *)(&this->field_0xdc + (long)p_Var14);
        iVar19 = *(int *)(&this->field_0xd4 + (long)p_Var14);
        iVar18 = 0;
        fVar22 = 0.0;
        iVar25 = 0;
        do {
          if (0 < *(int *)(&this->field_0xd4 + (long)p_Var14)) {
            lVar27 = 0;
            do {
              *(float *)(local_348._0_8_ + (iVar18 + lVar27) * 4) = fVar22;
              p_Var14 = pp_Var15[-3];
              fVar22 = (float)((int)fVar22 + *(int *)(&this->field_0xdc + (long)p_Var14));
              lVar27 = lVar27 + 1;
            } while ((int)lVar27 < *(int *)(&this->field_0xd4 + (long)p_Var14));
            iVar18 = iVar18 + (int)lVar27;
          }
          fVar22 = (float)((int)fVar22 + (iVar10 * iVar29 - iVar21 * iVar19));
          iVar25 = iVar25 + 1;
        } while (iVar25 < *(int *)(&this->field_0xd8 + (long)p_Var14));
      }
      if (0 < (int)local_1b8._0_4_) {
        iVar29 = (int)uVar35 * 8;
        local_158._0_4_ = iVar29;
        local_300 = 0;
        local_2f0 = (_func_int **)0x0;
        do {
          if (-1 < (int)local_298) {
            local_2f8 = (float *)(local_288.cstep * (long)local_2f0 * local_288.elemsize +
                                 (long)local_288.data);
            pauVar26 = (undefined1 (*) [16])
                       (top_blob->cstep * (long)local_2f0 * top_blob->elemsize +
                       (long)top_blob->data);
            pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx2;
            pvVar31 = (this->weight_data_int8).data;
            pvVar11 = (void *)0x0;
            pauVar30 = pauVar26;
            do {
              local_290 = pvVar11;
              iVar21 = (int)local_290;
              if (-1 < iVar16) {
                iVar19 = 0;
                do {
                  p_Var14 = pp_Var15[-3];
                  if ((int)uVar35 < 1) {
                    auVar81 = (undefined1  [16])0x0;
                    auVar57 = ZEXT816(0) << 0x40;
                  }
                  else {
                    auVar55 = ZEXT1664((undefined1  [16])0x0);
                    uVar32 = 0;
                    auVar71 = ZEXT1664((undefined1  [16])0x0);
                    do {
                      auVar126._8_8_ = 0;
                      auVar126._0_8_ =
                           *(ulong *)((long)local_2f8 +
                                     (long)(int)*(pointer)(local_348._0_8_ + uVar32 * 4) * 8 +
                                     (long)*(int *)(&this->field_0xe8 + (long)p_Var14) *
                                     (long)iVar21 * (long)local_288.w * local_288.elemsize +
                                     (long)(*(int *)(&this->field_0xe4 + (long)p_Var14) * iVar19 * 8
                                           ));
                      auVar57 = vpcmpgtb_avx((undefined1  [16])0x0,auVar126);
                      auVar81 = vpunpcklbw_avx(auVar126,auVar57);
                      auVar151._8_8_ = 0;
                      auVar151._0_8_ = *(ulong *)((long)pvVar31 + uVar32 * 8 + (long)(int)local_300)
                      ;
                      auVar57 = vpcmpgtb_avx((undefined1  [16])0x0,auVar151);
                      auVar57 = vpunpcklbw_avx(auVar151,auVar57);
                      auVar126 = vpmullw_avx(auVar57,auVar81);
                      auVar81 = vpmulhw_avx(auVar81,auVar57);
                      auVar57 = vpunpcklwd_avx(auVar126,auVar81);
                      auVar57 = vpaddd_avx(auVar57,auVar55._0_16_);
                      auVar55 = ZEXT1664(auVar57);
                      auVar81 = vpunpckhwd_avx(auVar126,auVar81);
                      auVar81 = vpaddd_avx(auVar81,auVar71._0_16_);
                      auVar71 = ZEXT1664(auVar81);
                      uVar32 = uVar32 + 1;
                    } while ((uVar35 & 0xffffffff) != uVar32);
                    auVar57 = vcvtdq2ps_avx(auVar57);
                    auVar81 = vcvtdq2ps_avx(auVar81);
                  }
                  auVar126 = *(undefined1 (*) [16])
                              (*(long *)(&this->field_0x1f8 + (long)p_Var14) +
                              (long)local_2f0 * 0x20);
                  auVar151 = *(undefined1 (*) [16])
                              (*(long *)(&this->field_0x1f8 + (long)p_Var14) + 0x10 +
                              (long)local_2f0 * 0x20);
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var14) +
                                    (long)local_2f0 * 0x20);
                  auVar152._0_4_ = auVar126._0_4_ * *pfVar1;
                  auVar152._4_4_ = auVar126._4_4_ * pfVar1[1];
                  auVar152._8_4_ = auVar126._8_4_ * pfVar1[2];
                  auVar152._12_4_ = auVar126._12_4_ * pfVar1[3];
                  auVar153 = vrcpps_avx(auVar152);
                  pfVar1 = (float *)(*(long *)(&this->field_0x240 + (long)p_Var14) + 0x10 +
                                    (long)local_2f0 * 0x20);
                  auVar161._0_4_ = auVar151._0_4_ * *pfVar1;
                  auVar161._4_4_ = auVar151._4_4_ * pfVar1[1];
                  auVar161._8_4_ = auVar151._8_4_ * pfVar1[2];
                  auVar161._12_4_ = auVar151._12_4_ * pfVar1[3];
                  auVar164 = vrcpps_avx(auVar161);
                  auVar126 = vcmpps_avx(auVar126,(undefined1  [16])0x0,4);
                  auVar126 = vandps_avx(auVar153,auVar126);
                  auVar153._0_4_ = auVar57._0_4_ * auVar126._0_4_;
                  auVar153._4_4_ = auVar57._4_4_ * auVar126._4_4_;
                  auVar153._8_4_ = auVar57._8_4_ * auVar126._8_4_;
                  auVar153._12_4_ = auVar57._12_4_ * auVar126._12_4_;
                  auVar57 = vcmpps_avx(auVar151,(undefined1  [16])0x0,4);
                  auVar57 = vandps_avx(auVar164,auVar57);
                  auVar164._0_4_ = auVar57._0_4_ * auVar81._0_4_;
                  auVar164._4_4_ = auVar57._4_4_ * auVar81._4_4_;
                  auVar164._8_4_ = auVar57._8_4_ * auVar81._8_4_;
                  auVar164._12_4_ = auVar57._12_4_ * auVar81._12_4_;
                  if (*(int *)(&this->field_0x100 + (long)p_Var14) != 0) {
                    pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var14) +
                                      (long)local_2f0 * 0x20);
                    auVar153._0_4_ = auVar153._0_4_ + *pfVar1;
                    auVar153._4_4_ = auVar153._4_4_ + pfVar1[1];
                    auVar153._8_4_ = auVar153._8_4_ + pfVar1[2];
                    auVar153._12_4_ = auVar153._12_4_ + pfVar1[3];
                    pfVar1 = (float *)(*(long *)(&this->field_0x1b0 + (long)p_Var14) + 0x10 +
                                      (long)local_2f0 * 0x20);
                    auVar164._0_4_ = auVar164._0_4_ + *pfVar1;
                    auVar164._4_4_ = auVar164._4_4_ + pfVar1[1];
                    auVar164._8_4_ = auVar164._8_4_ + pfVar1[2];
                    auVar164._12_4_ = auVar164._12_4_ + pfVar1[3];
                  }
                  fVar165 = auVar164._4_4_;
                  fVar72 = auVar164._8_4_;
                  fVar22 = auVar153._4_4_;
                  fVar37 = auVar153._8_4_;
                  fVar157 = auVar153._12_4_;
                  fVar166 = auVar164._12_4_;
                  switch(*(undefined4 *)(&this->field_0x110 + (long)p_Var14)) {
                  case 1:
                    auVar153 = vmaxps_avx(auVar153,(undefined1  [16])0x0);
                    auVar164 = vmaxps_avx(auVar164,(undefined1  [16])0x0);
                    break;
                  case 2:
                    auVar57 = vmaxps_avx(auVar153,(undefined1  [16])0x0);
                    auVar81 = vminps_avx(auVar153,(undefined1  [16])0x0);
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var14);
                    auVar66._4_4_ = uVar2;
                    auVar66._0_4_ = uVar2;
                    auVar66._8_4_ = uVar2;
                    auVar66._12_4_ = uVar2;
                    auVar153 = vfmadd213ps_fma(auVar81,auVar66,auVar57);
                    auVar57 = vmaxps_avx(auVar164,(undefined1  [16])0x0);
                    auVar81 = vminps_avx(auVar164,(undefined1  [16])0x0);
                    auVar164 = vfmadd213ps_fma(auVar81,auVar66,auVar57);
                    break;
                  case 3:
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var14);
                    auVar45._4_4_ = uVar2;
                    auVar45._0_4_ = uVar2;
                    auVar45._8_4_ = uVar2;
                    auVar45._12_4_ = uVar2;
                    uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var14))[1];
                    auVar64._4_4_ = uVar2;
                    auVar64._0_4_ = uVar2;
                    auVar64._8_4_ = uVar2;
                    auVar64._12_4_ = uVar2;
                    auVar57 = vmaxps_avx(auVar153,auVar45);
                    auVar153 = vminps_avx(auVar57,auVar64);
                    auVar57 = vmaxps_avx(auVar164,auVar45);
                    auVar164 = vminps_avx(auVar57,auVar64);
                    break;
                  case 4:
                    auVar46._0_8_ = auVar153._0_8_ ^ 0x8000000080000000;
                    auVar46._8_4_ = -fVar37;
                    auVar46._12_4_ = -fVar157;
                    auVar105._8_4_ = 0x42b0c0a5;
                    auVar105._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar105._12_4_ = 0x42b0c0a5;
                    auVar57 = vminps_avx(auVar46,auVar105);
                    auVar103._8_4_ = 0xc2b0c0a5;
                    auVar103._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar103._12_4_ = 0xc2b0c0a5;
                    auVar126 = vmaxps_avx(auVar57,auVar103);
                    auVar150._8_4_ = 0x3fb8aa3b;
                    auVar150._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar150._12_4_ = 0x3fb8aa3b;
                    auVar97._8_4_ = 0x3f000000;
                    auVar97._0_8_ = 0x3f0000003f000000;
                    auVar97._12_4_ = 0x3f000000;
                    auVar57 = vfmadd213ps_fma(auVar150,auVar126,auVar97);
                    auVar154._0_4_ = (int)auVar57._0_4_;
                    auVar154._4_4_ = (int)auVar57._4_4_;
                    auVar154._8_4_ = (int)auVar57._8_4_;
                    auVar154._12_4_ = (int)auVar57._12_4_;
                    auVar81 = vcvtdq2ps_avx(auVar154);
                    auVar57 = vcmpps_avx(auVar57,auVar81,1);
                    auVar94._8_4_ = 0x3f800000;
                    auVar94._0_8_ = 0x3f8000003f800000;
                    auVar94._12_4_ = 0x3f800000;
                    auVar57 = vandps_avx(auVar57,auVar94);
                    auVar151 = vsubps_avx(auVar81,auVar57);
                    auVar47._8_4_ = 0x3f317218;
                    auVar47._0_8_ = 0x3f3172183f317218;
                    auVar47._12_4_ = 0x3f317218;
                    auVar81 = vfnmadd231ps_fma(auVar126,auVar151,auVar47);
                    fVar22 = auVar81._0_4_;
                    auVar155._0_4_ = fVar22 * fVar22;
                    fVar37 = auVar81._4_4_;
                    auVar155._4_4_ = fVar37 * fVar37;
                    fVar157 = auVar81._8_4_;
                    auVar155._8_4_ = fVar157 * fVar157;
                    fVar165 = auVar81._12_4_;
                    auVar155._12_4_ = fVar165 * fVar165;
                    auVar162._8_4_ = 0x39506967;
                    auVar162._0_8_ = 0x3950696739506967;
                    auVar162._12_4_ = 0x39506967;
                    auVar87._8_4_ = 0x3ab743ce;
                    auVar87._0_8_ = 0x3ab743ce3ab743ce;
                    auVar87._12_4_ = 0x3ab743ce;
                    auVar57 = vfmadd213ps_fma(auVar162,auVar81,auVar87);
                    auVar138._8_4_ = 0x3c088908;
                    auVar138._0_8_ = 0x3c0889083c088908;
                    auVar138._12_4_ = 0x3c088908;
                    auVar57 = vfmadd213ps_fma(auVar57,auVar81,auVar138);
                    auVar88._8_4_ = 0x3d2aa9c1;
                    auVar88._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar88._12_4_ = 0x3d2aa9c1;
                    auVar57 = vfmadd213ps_fma(auVar57,auVar81,auVar88);
                    auVar89._8_4_ = 0x3e2aaaaa;
                    auVar89._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar89._12_4_ = 0x3e2aaaaa;
                    auVar57 = vfmadd213ps_fma(auVar57,auVar81,auVar89);
                    auVar57 = vfmadd213ps_fma(auVar57,auVar81,auVar97);
                    auVar65._0_4_ = fVar22 + 1.0;
                    auVar65._4_4_ = fVar37 + 1.0;
                    auVar65._8_4_ = fVar157 + 1.0;
                    auVar65._12_4_ = fVar165 + 1.0;
                    auVar153 = vfmadd231ps_fma(auVar65,auVar155,auVar57);
                    auVar124._0_8_ = auVar164._0_8_ ^ 0x8000000080000000;
                    auVar124._8_4_ = -fVar72;
                    auVar124._12_4_ = -fVar166;
                    auVar57 = vminps_avx(auVar124,auVar105);
                    auVar126 = vmaxps_avx(auVar57,auVar103);
                    auVar57 = vfmadd213ps_fma(auVar150,auVar126,auVar97);
                    auVar160._0_4_ = (int)auVar57._0_4_;
                    auVar160._4_4_ = (int)auVar57._4_4_;
                    auVar160._8_4_ = (int)auVar57._8_4_;
                    auVar160._12_4_ = (int)auVar57._12_4_;
                    auVar81 = vcvtdq2ps_avx(auVar160);
                    auVar57 = vcmpps_avx(auVar57,auVar81,1);
                    auVar57 = vandps_avx(auVar57,auVar94);
                    auVar81 = vsubps_avx(auVar81,auVar57);
                    auVar126 = vfnmadd231ps_fma(auVar126,auVar81,auVar47);
                    fVar22 = auVar126._0_4_;
                    auVar156._0_4_ = fVar22 * fVar22;
                    fVar37 = auVar126._4_4_;
                    auVar156._4_4_ = fVar37 * fVar37;
                    fVar157 = auVar126._8_4_;
                    auVar156._8_4_ = fVar157 * fVar157;
                    fVar165 = auVar126._12_4_;
                    auVar156._12_4_ = fVar165 * fVar165;
                    auVar48._8_4_ = 0x3ab743ce;
                    auVar48._0_8_ = 0x3ab743ce3ab743ce;
                    auVar48._12_4_ = 0x3ab743ce;
                    auVar57 = vfmadd213ps_fma(auVar162,auVar126,auVar48);
                    auVar57 = vfmadd213ps_fma(auVar57,auVar126,auVar138);
                    auVar49._8_4_ = 0x3d2aa9c1;
                    auVar49._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar49._12_4_ = 0x3d2aa9c1;
                    auVar57 = vfmadd213ps_fma(auVar57,auVar126,auVar49);
                    auVar57 = vfmadd213ps_fma(auVar57,auVar126,auVar89);
                    auVar57 = vfmadd213ps_fma(auVar57,auVar126,auVar97);
                    auVar125._0_4_ = fVar22 + 1.0;
                    auVar125._4_4_ = fVar37 + 1.0;
                    auVar125._8_4_ = fVar157 + 1.0;
                    auVar125._12_4_ = fVar165 + 1.0;
                    auVar164 = vfmadd231ps_fma(auVar125,auVar156,auVar57);
                    auVar50._0_4_ = (int)auVar151._0_4_;
                    auVar50._4_4_ = (int)auVar151._4_4_;
                    auVar50._8_4_ = (int)auVar151._8_4_;
                    auVar50._12_4_ = (int)auVar151._12_4_;
                    auVar57 = vpslld_avx(auVar50,0x17);
                    auVar163._8_4_ = 0x3f800000;
                    auVar163._0_8_ = 0x3f8000003f800000;
                    auVar163._12_4_ = 0x3f800000;
                    auVar57 = vpaddd_avx(auVar163,auVar57);
                    auVar126 = vfmadd213ps_fma(auVar57,auVar153,auVar94);
                    auVar57 = vrcpps_avx(auVar126);
                    auVar126 = vfmsub213ps_fma(auVar126,auVar57,auVar94);
                    auVar153 = vfnmadd132ps_fma(auVar126,auVar57,auVar57);
                    auVar51._0_4_ = (int)auVar81._0_4_;
                    auVar51._4_4_ = (int)auVar81._4_4_;
                    auVar51._8_4_ = (int)auVar81._8_4_;
                    auVar51._12_4_ = (int)auVar81._12_4_;
                    auVar57 = vpslld_avx(auVar51,0x17);
                    auVar57 = vpaddd_avx(auVar163,auVar57);
                    auVar81 = vfmadd213ps_fma(auVar57,auVar164,auVar94);
                    auVar57 = vrcpps_avx(auVar81);
                    auVar81 = vfmsub213ps_fma(auVar81,auVar57,auVar94);
                    auVar164 = vfnmadd132ps_fma(auVar81,auVar57,auVar57);
                    break;
                  case 5:
                    auVar140._8_4_ = 0x42b0c0a5;
                    auVar140._0_8_ = 0x42b0c0a542b0c0a5;
                    auVar140._12_4_ = 0x42b0c0a5;
                    auVar57 = vminps_avx(auVar153,auVar140);
                    auVar104._8_4_ = 0xc2b0c0a5;
                    auVar104._0_8_ = 0xc2b0c0a5c2b0c0a5;
                    auVar104._12_4_ = 0xc2b0c0a5;
                    auVar126 = vmaxps_avx(auVar57,auVar104);
                    auVar98._8_4_ = 0x3fb8aa3b;
                    auVar98._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar98._12_4_ = 0x3fb8aa3b;
                    auVar92._8_4_ = 0x3f000000;
                    auVar92._0_8_ = 0x3f0000003f000000;
                    auVar92._12_4_ = 0x3f000000;
                    auVar57 = vfmadd213ps_fma(auVar98,auVar126,auVar92);
                    auVar106._0_4_ = (int)auVar57._0_4_;
                    auVar106._4_4_ = (int)auVar57._4_4_;
                    auVar106._8_4_ = (int)auVar57._8_4_;
                    auVar106._12_4_ = (int)auVar57._12_4_;
                    auVar81 = vcvtdq2ps_avx(auVar106);
                    auVar57 = vcmpps_avx(auVar57,auVar81,1);
                    auVar96._8_4_ = 0x3f800000;
                    auVar96._0_8_ = 0x3f8000003f800000;
                    auVar96._12_4_ = 0x3f800000;
                    auVar57 = vandps_avx(auVar57,auVar96);
                    auVar57 = vsubps_avx(auVar81,auVar57);
                    auVar146._8_4_ = 0x3f317218;
                    auVar146._0_8_ = 0x3f3172183f317218;
                    auVar146._12_4_ = 0x3f317218;
                    auVar126 = vfnmadd231ps_fma(auVar126,auVar57,auVar146);
                    fVar22 = auVar126._0_4_;
                    auVar107._0_4_ = fVar22 * fVar22;
                    fVar37 = auVar126._4_4_;
                    auVar107._4_4_ = fVar37 * fVar37;
                    fVar157 = auVar126._8_4_;
                    auVar107._8_4_ = fVar157 * fVar157;
                    fVar165 = auVar126._12_4_;
                    auVar107._12_4_ = fVar165 * fVar165;
                    auVar158._8_4_ = 0x39506967;
                    auVar158._0_8_ = 0x3950696739506967;
                    auVar158._12_4_ = 0x39506967;
                    auVar73._8_4_ = 0x3ab743ce;
                    auVar73._0_8_ = 0x3ab743ce3ab743ce;
                    auVar73._12_4_ = 0x3ab743ce;
                    auVar81 = vfmadd213ps_fma(auVar158,auVar126,auVar73);
                    auVar74._8_4_ = 0x3c088908;
                    auVar74._0_8_ = 0x3c0889083c088908;
                    auVar74._12_4_ = 0x3c088908;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar74);
                    auVar75._8_4_ = 0x3d2aa9c1;
                    auVar75._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar75._12_4_ = 0x3d2aa9c1;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar75);
                    auVar76._8_4_ = 0x3e2aaaaa;
                    auVar76._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar76._12_4_ = 0x3e2aaaaa;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar76);
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar92);
                    auVar38._0_4_ = fVar22 + 1.0;
                    auVar38._4_4_ = fVar37 + 1.0;
                    auVar38._8_4_ = fVar157 + 1.0;
                    auVar38._12_4_ = fVar165 + 1.0;
                    auVar81 = vfmadd231ps_fma(auVar38,auVar107,auVar81);
                    auVar56._0_4_ = (int)auVar57._0_4_;
                    auVar56._4_4_ = (int)auVar57._4_4_;
                    auVar56._8_4_ = (int)auVar57._8_4_;
                    auVar56._12_4_ = (int)auVar57._12_4_;
                    auVar57 = vpslld_avx(auVar56,0x17);
                    auVar159._8_4_ = 0x3f800000;
                    auVar159._0_8_ = 0x3f8000003f800000;
                    auVar159._12_4_ = 0x3f800000;
                    auVar57 = vpaddd_avx(auVar159,auVar57);
                    auVar57 = vfmadd213ps_fma(auVar57,auVar81,auVar96);
                    auVar81 = vcmpps_avx(auVar57,(undefined1  [16])0x0,2);
                    auVar39._8_4_ = 0x800000;
                    auVar39._0_8_ = 0x80000000800000;
                    auVar39._12_4_ = 0x800000;
                    auVar57 = vmaxps_avx(auVar57,auVar39);
                    auVar126 = vpsrld_avx(auVar57,0x17);
                    local_228._8_4_ = 0x807fffff;
                    local_228._0_8_ = 0x807fffff807fffff;
                    local_228._12_4_ = 0x807fffff;
                    local_218._8_4_ = 0x3f000000;
                    local_218._0_8_ = 0x3f0000003f000000;
                    local_218._12_4_ = 0x3f000000;
                    auVar57 = vandps_avx(auVar57,local_228);
                    auVar152 = vorps_avx(auVar57,local_218);
                    local_148._8_4_ = 0xffffff82;
                    local_148._0_8_ = 0xffffff82ffffff82;
                    local_148._12_4_ = 0xffffff82;
                    auVar57 = vpaddd_avx(auVar126,local_148);
                    auVar151 = vcvtdq2ps_avx(auVar57);
                    auVar57._8_4_ = 0x3f3504f3;
                    auVar57._0_8_ = 0x3f3504f33f3504f3;
                    auVar57._12_4_ = 0x3f3504f3;
                    auVar126 = vcmpps_avx(auVar152,auVar57,1);
                    auVar57 = vandps_avx(auVar126,auVar152);
                    auVar77._0_4_ = auVar57._0_4_ + auVar152._0_4_ + -1.0;
                    auVar77._4_4_ = auVar57._4_4_ + auVar152._4_4_ + -1.0;
                    auVar77._8_4_ = auVar57._8_4_ + auVar152._8_4_ + -1.0;
                    auVar77._12_4_ = auVar57._12_4_ + auVar152._12_4_ + -1.0;
                    auVar57 = vandps_avx(auVar126,auVar96);
                    auVar57 = vsubps_avx(auVar151,auVar57);
                    auVar141._0_4_ = auVar77._0_4_ * auVar77._0_4_;
                    auVar141._4_4_ = auVar77._4_4_ * auVar77._4_4_;
                    auVar141._8_4_ = auVar77._8_4_ * auVar77._8_4_;
                    auVar141._12_4_ = auVar77._12_4_ * auVar77._12_4_;
                    auVar147._8_4_ = 0x3d9021bb;
                    auVar147._0_8_ = 0x3d9021bb3d9021bb;
                    auVar147._12_4_ = 0x3d9021bb;
                    auVar108._8_4_ = 0xbdebd1b8;
                    auVar108._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar108._12_4_ = 0xbdebd1b8;
                    auVar126 = vfmadd213ps_fma(auVar147,auVar77,auVar108);
                    auVar109._8_4_ = 0x3def251a;
                    auVar109._0_8_ = 0x3def251a3def251a;
                    auVar109._12_4_ = 0x3def251a;
                    auVar126 = vfmadd213ps_fma(auVar126,auVar77,auVar109);
                    auVar110._8_4_ = 0xbdfe5d4f;
                    auVar110._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar110._12_4_ = 0xbdfe5d4f;
                    auVar126 = vfmadd213ps_fma(auVar126,auVar77,auVar110);
                    auVar111._8_4_ = 0x3e11e9bf;
                    auVar111._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar111._12_4_ = 0x3e11e9bf;
                    auVar126 = vfmadd213ps_fma(auVar126,auVar77,auVar111);
                    auVar112._8_4_ = 0xbe2aae50;
                    auVar112._0_8_ = 0xbe2aae50be2aae50;
                    auVar112._12_4_ = 0xbe2aae50;
                    auVar126 = vfmadd213ps_fma(auVar126,auVar77,auVar112);
                    auVar113._8_4_ = 0x3e4cceac;
                    auVar113._0_8_ = 0x3e4cceac3e4cceac;
                    auVar113._12_4_ = 0x3e4cceac;
                    auVar126 = vfmadd213ps_fma(auVar126,auVar77,auVar113);
                    auVar114._8_4_ = 0xbe7ffffc;
                    auVar114._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar114._12_4_ = 0xbe7ffffc;
                    auVar126 = vfmadd213ps_fma(auVar126,auVar77,auVar114);
                    auVar115._8_4_ = 0x3eaaaaaa;
                    auVar115._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar115._12_4_ = 0x3eaaaaaa;
                    auVar126 = vfmadd213ps_fma(auVar126,auVar77,auVar115);
                    auVar126 = vfmsub213ps_fma(auVar126,auVar77,auVar92);
                    auVar57 = vfmadd213ps_fma(auVar57,auVar146,auVar77);
                    auVar57 = vfmadd231ps_fma(auVar57,auVar141,auVar126);
                    auVar78._0_4_ = auVar57._0_4_ * -2.0;
                    auVar78._4_4_ = auVar57._4_4_ * -2.0;
                    auVar78._8_4_ = auVar57._8_4_ * -2.0;
                    auVar78._12_4_ = auVar57._12_4_ * -2.0;
                    auVar116._8_4_ = 0x7fffffff;
                    auVar116._0_8_ = 0x7fffffff7fffffff;
                    auVar116._12_4_ = 0x7fffffff;
                    auVar57 = vblendvps_avx(auVar78,auVar116,auVar81);
                    auVar57 = vminps_avx(auVar57,auVar140);
                    auVar126 = vmaxps_avx(auVar57,auVar104);
                    auVar57 = vfmadd213ps_fma(auVar98,auVar126,auVar92);
                    auVar142._0_4_ = (int)auVar57._0_4_;
                    auVar142._4_4_ = (int)auVar57._4_4_;
                    auVar142._8_4_ = (int)auVar57._8_4_;
                    auVar142._12_4_ = (int)auVar57._12_4_;
                    auVar81 = vcvtdq2ps_avx(auVar142);
                    auVar57 = vcmpps_avx(auVar57,auVar81,1);
                    auVar57 = vandps_avx(auVar57,auVar96);
                    auVar57 = vsubps_avx(auVar81,auVar57);
                    auVar126 = vfnmadd231ps_fma(auVar126,auVar57,auVar146);
                    fVar22 = auVar126._0_4_;
                    auVar143._0_4_ = fVar22 * fVar22;
                    fVar37 = auVar126._4_4_;
                    auVar143._4_4_ = fVar37 * fVar37;
                    fVar157 = auVar126._8_4_;
                    auVar143._8_4_ = fVar157 * fVar157;
                    fVar165 = auVar126._12_4_;
                    auVar143._12_4_ = fVar165 * fVar165;
                    auVar148._8_4_ = 0x39506967;
                    auVar148._0_8_ = 0x3950696739506967;
                    auVar148._12_4_ = 0x39506967;
                    auVar117._8_4_ = 0x3ab743ce;
                    auVar117._0_8_ = 0x3ab743ce3ab743ce;
                    auVar117._12_4_ = 0x3ab743ce;
                    auVar81 = vfmadd213ps_fma(auVar148,auVar126,auVar117);
                    auVar118._8_4_ = 0x3c088908;
                    auVar118._0_8_ = 0x3c0889083c088908;
                    auVar118._12_4_ = 0x3c088908;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar118);
                    auVar119._8_4_ = 0x3d2aa9c1;
                    auVar119._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar119._12_4_ = 0x3d2aa9c1;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar119);
                    auVar120._8_4_ = 0x3e2aaaaa;
                    auVar120._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar120._12_4_ = 0x3e2aaaaa;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar120);
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar92);
                    auVar79._0_4_ = fVar22 + 1.0;
                    auVar79._4_4_ = fVar37 + 1.0;
                    auVar79._8_4_ = fVar157 + 1.0;
                    auVar79._12_4_ = fVar165 + 1.0;
                    auVar81 = vfmadd231ps_fma(auVar79,auVar143,auVar81);
                    auVar127._0_4_ = (int)auVar57._0_4_;
                    auVar127._4_4_ = (int)auVar57._4_4_;
                    auVar127._8_4_ = (int)auVar57._8_4_;
                    auVar127._12_4_ = (int)auVar57._12_4_;
                    auVar57 = vpslld_avx(auVar127,0x17);
                    auVar57 = vpaddd_avx(auVar57,auVar159);
                    auVar81 = vfmadd213ps_fma(auVar57,auVar81,auVar96);
                    auVar57 = vrcpps_avx(auVar81);
                    auVar128._0_4_ = auVar57._0_4_ + auVar57._0_4_;
                    auVar128._4_4_ = auVar57._4_4_ + auVar57._4_4_;
                    auVar128._8_4_ = auVar57._8_4_ + auVar57._8_4_;
                    auVar128._12_4_ = auVar57._12_4_ + auVar57._12_4_;
                    auVar121._8_4_ = 0x40000000;
                    auVar121._0_8_ = 0x4000000040000000;
                    auVar121._12_4_ = 0x40000000;
                    auVar81 = vfmsub213ps_fma(auVar81,auVar128,auVar121);
                    auVar161 = vfnmadd213ps_fma(auVar81,auVar57,auVar128);
                    auVar57 = vminps_avx(auVar164,auVar140);
                    auVar126 = vmaxps_avx(auVar57,auVar104);
                    auVar57 = vfmadd213ps_fma(auVar98,auVar126,auVar92);
                    auVar144._0_4_ = (int)auVar57._0_4_;
                    auVar144._4_4_ = (int)auVar57._4_4_;
                    auVar144._8_4_ = (int)auVar57._8_4_;
                    auVar144._12_4_ = (int)auVar57._12_4_;
                    auVar81 = vcvtdq2ps_avx(auVar144);
                    auVar57 = vcmpps_avx(auVar57,auVar81,1);
                    auVar57 = vandps_avx(auVar57,auVar96);
                    auVar57 = vsubps_avx(auVar81,auVar57);
                    auVar126 = vfnmadd231ps_fma(auVar126,auVar57,auVar146);
                    fVar22 = auVar126._0_4_;
                    auVar145._0_4_ = fVar22 * fVar22;
                    fVar37 = auVar126._4_4_;
                    auVar145._4_4_ = fVar37 * fVar37;
                    fVar157 = auVar126._8_4_;
                    auVar145._8_4_ = fVar157 * fVar157;
                    fVar165 = auVar126._12_4_;
                    auVar145._12_4_ = fVar165 * fVar165;
                    auVar149._8_4_ = 0x39506967;
                    auVar149._0_8_ = 0x3950696739506967;
                    auVar149._12_4_ = 0x39506967;
                    auVar122._8_4_ = 0x3ab743ce;
                    auVar122._0_8_ = 0x3ab743ce3ab743ce;
                    auVar122._12_4_ = 0x3ab743ce;
                    auVar81 = vfmadd213ps_fma(auVar149,auVar126,auVar122);
                    auVar58._8_4_ = 0x3c088908;
                    auVar58._0_8_ = 0x3c0889083c088908;
                    auVar58._12_4_ = 0x3c088908;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar58);
                    auVar59._8_4_ = 0x3d2aa9c1;
                    auVar59._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar59._12_4_ = 0x3d2aa9c1;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar59);
                    auVar60._8_4_ = 0x3e2aaaaa;
                    auVar60._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar60._12_4_ = 0x3e2aaaaa;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar60);
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar92);
                    auVar80._0_4_ = fVar22 + 1.0;
                    auVar80._4_4_ = fVar37 + 1.0;
                    auVar80._8_4_ = fVar157 + 1.0;
                    auVar80._12_4_ = fVar165 + 1.0;
                    auVar81 = vfmadd231ps_fma(auVar80,auVar145,auVar81);
                    auVar129._0_4_ = (int)auVar57._0_4_;
                    auVar129._4_4_ = (int)auVar57._4_4_;
                    auVar129._8_4_ = (int)auVar57._8_4_;
                    auVar129._12_4_ = (int)auVar57._12_4_;
                    auVar57 = vpslld_avx(auVar129,0x17);
                    auVar57 = vpaddd_avx(auVar57,auVar159);
                    auVar152 = vfmadd213ps_fma(auVar57,auVar81,auVar96);
                    auVar40._8_4_ = 0x800000;
                    auVar40._0_8_ = 0x80000000800000;
                    auVar40._12_4_ = 0x800000;
                    auVar81 = vmaxps_avx(auVar152,auVar40);
                    auVar57 = vandps_avx(auVar81,local_228);
                    auVar81 = vpsrld_avx(auVar81,0x17);
                    auVar126 = vorps_avx(auVar57,local_218);
                    auVar151 = vpaddd_avx(auVar81,local_148);
                    auVar82._8_4_ = 0x3f3504f3;
                    auVar82._0_8_ = 0x3f3504f33f3504f3;
                    auVar82._12_4_ = 0x3f3504f3;
                    auVar81 = vcmpps_avx(auVar126,auVar82,1);
                    auVar57 = vandps_avx(auVar81,auVar126);
                    auVar41._0_4_ = auVar57._0_4_ + auVar126._0_4_ + -1.0;
                    auVar41._4_4_ = auVar57._4_4_ + auVar126._4_4_ + -1.0;
                    auVar41._8_4_ = auVar57._8_4_ + auVar126._8_4_ + -1.0;
                    auVar41._12_4_ = auVar57._12_4_ + auVar126._12_4_ + -1.0;
                    auVar126 = vcmpps_avx(auVar152,(undefined1  [16])0x0,2);
                    auVar151 = vcvtdq2ps_avx(auVar151);
                    auVar57 = vandps_avx(auVar81,auVar96);
                    auVar57 = vsubps_avx(auVar151,auVar57);
                    auVar83._8_4_ = 0x3d9021bb;
                    auVar83._0_8_ = 0x3d9021bb3d9021bb;
                    auVar83._12_4_ = 0x3d9021bb;
                    auVar130._8_4_ = 0xbdebd1b8;
                    auVar130._0_8_ = 0xbdebd1b8bdebd1b8;
                    auVar130._12_4_ = 0xbdebd1b8;
                    auVar81 = vfmadd213ps_fma(auVar83,auVar41,auVar130);
                    auVar131._8_4_ = 0x3def251a;
                    auVar131._0_8_ = 0x3def251a3def251a;
                    auVar131._12_4_ = 0x3def251a;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar41,auVar131);
                    auVar132._8_4_ = 0xbdfe5d4f;
                    auVar132._0_8_ = 0xbdfe5d4fbdfe5d4f;
                    auVar132._12_4_ = 0xbdfe5d4f;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar41,auVar132);
                    auVar133._8_4_ = 0x3e11e9bf;
                    auVar133._0_8_ = 0x3e11e9bf3e11e9bf;
                    auVar133._12_4_ = 0x3e11e9bf;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar41,auVar133);
                    auVar134._8_4_ = 0xbe2aae50;
                    auVar134._0_8_ = 0xbe2aae50be2aae50;
                    auVar134._12_4_ = 0xbe2aae50;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar41,auVar134);
                    auVar135._8_4_ = 0x3e4cceac;
                    auVar135._0_8_ = 0x3e4cceac3e4cceac;
                    auVar135._12_4_ = 0x3e4cceac;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar41,auVar135);
                    auVar136._8_4_ = 0xbe7ffffc;
                    auVar136._0_8_ = 0xbe7ffffcbe7ffffc;
                    auVar136._12_4_ = 0xbe7ffffc;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar41,auVar136);
                    auVar137._8_4_ = 0x3eaaaaaa;
                    auVar137._0_8_ = 0x3eaaaaaa3eaaaaaa;
                    auVar137._12_4_ = 0x3eaaaaaa;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar41,auVar137);
                    auVar81 = vfmsub213ps_fma(auVar81,auVar41,auVar92);
                    auVar57 = vfmadd213ps_fma(auVar57,auVar146,auVar41);
                    auVar42._0_4_ = auVar41._0_4_ * auVar41._0_4_;
                    auVar42._4_4_ = auVar41._4_4_ * auVar41._4_4_;
                    auVar42._8_4_ = auVar41._8_4_ * auVar41._8_4_;
                    auVar42._12_4_ = auVar41._12_4_ * auVar41._12_4_;
                    auVar57 = vfmadd231ps_fma(auVar57,auVar42,auVar81);
                    auVar43._0_4_ = auVar57._0_4_ * -2.0;
                    auVar43._4_4_ = auVar57._4_4_ * -2.0;
                    auVar43._8_4_ = auVar57._8_4_ * -2.0;
                    auVar43._12_4_ = auVar57._12_4_ * -2.0;
                    auVar61._8_4_ = 0x7fffffff;
                    auVar61._0_8_ = 0x7fffffff7fffffff;
                    auVar61._12_4_ = 0x7fffffff;
                    auVar57 = vblendvps_avx(auVar43,auVar61,auVar126);
                    auVar57 = vminps_avx(auVar140,auVar57);
                    auVar126 = vmaxps_avx(auVar57,auVar104);
                    auVar62._8_4_ = 0x3fb8aa3b;
                    auVar62._0_8_ = 0x3fb8aa3b3fb8aa3b;
                    auVar62._12_4_ = 0x3fb8aa3b;
                    auVar57 = vfmadd213ps_fma(auVar62,auVar126,auVar92);
                    auVar84._0_4_ = (int)auVar57._0_4_;
                    auVar84._4_4_ = (int)auVar57._4_4_;
                    auVar84._8_4_ = (int)auVar57._8_4_;
                    auVar84._12_4_ = (int)auVar57._12_4_;
                    auVar81 = vcvtdq2ps_avx(auVar84);
                    auVar57 = vcmpps_avx(auVar57,auVar81,1);
                    auVar57 = vandps_avx(auVar57,auVar96);
                    auVar57 = vsubps_avx(auVar81,auVar57);
                    auVar126 = vfnmadd231ps_fma(auVar126,auVar57,auVar146);
                    fVar22 = auVar126._0_4_;
                    auVar85._0_4_ = fVar22 * fVar22;
                    fVar37 = auVar126._4_4_;
                    auVar85._4_4_ = fVar37 * fVar37;
                    fVar157 = auVar126._8_4_;
                    auVar85._8_4_ = fVar157 * fVar157;
                    fVar165 = auVar126._12_4_;
                    auVar85._12_4_ = fVar165 * fVar165;
                    auVar123._8_4_ = 0x39506967;
                    auVar123._0_8_ = 0x3950696739506967;
                    auVar123._12_4_ = 0x39506967;
                    auVar99._8_4_ = 0x3ab743ce;
                    auVar99._0_8_ = 0x3ab743ce3ab743ce;
                    auVar99._12_4_ = 0x3ab743ce;
                    auVar81 = vfmadd213ps_fma(auVar123,auVar126,auVar99);
                    auVar100._8_4_ = 0x3c088908;
                    auVar100._0_8_ = 0x3c0889083c088908;
                    auVar100._12_4_ = 0x3c088908;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar100);
                    auVar101._8_4_ = 0x3d2aa9c1;
                    auVar101._0_8_ = 0x3d2aa9c13d2aa9c1;
                    auVar101._12_4_ = 0x3d2aa9c1;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar101);
                    auVar102._8_4_ = 0x3e2aaaaa;
                    auVar102._0_8_ = 0x3e2aaaaa3e2aaaaa;
                    auVar102._12_4_ = 0x3e2aaaaa;
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar102);
                    auVar81 = vfmadd213ps_fma(auVar81,auVar126,auVar92);
                    auVar44._0_4_ = fVar22 + 1.0;
                    auVar44._4_4_ = fVar37 + 1.0;
                    auVar44._8_4_ = fVar157 + 1.0;
                    auVar44._12_4_ = fVar165 + 1.0;
                    auVar81 = vfmadd231ps_fma(auVar44,auVar85,auVar81);
                    auVar63._0_4_ = (int)auVar57._0_4_;
                    auVar63._4_4_ = (int)auVar57._4_4_;
                    auVar63._8_4_ = (int)auVar57._8_4_;
                    auVar63._12_4_ = (int)auVar57._12_4_;
                    auVar57 = vpslld_avx(auVar63,0x17);
                    auVar57 = vpaddd_avx(auVar159,auVar57);
                    auVar81 = vfmadd213ps_fma(auVar57,auVar81,auVar96);
                    auVar57 = vrcpps_avx(auVar81);
                    auVar86._0_4_ = auVar57._0_4_ + auVar57._0_4_;
                    auVar86._4_4_ = auVar57._4_4_ + auVar57._4_4_;
                    auVar86._8_4_ = auVar57._8_4_ + auVar57._8_4_;
                    auVar86._12_4_ = auVar57._12_4_ + auVar57._12_4_;
                    auVar93._8_4_ = 0x40000000;
                    auVar93._0_8_ = 0x4000000040000000;
                    auVar93._12_4_ = 0x40000000;
                    auVar81 = vfmsub213ps_fma(auVar81,auVar86,auVar93);
                    auVar57 = vfnmadd213ps_fma(auVar81,auVar57,auVar86);
                    auVar153 = vfmsub231ps_fma(auVar153,auVar153,auVar161);
                    auVar164 = vfmsub231ps_fma(auVar164,auVar164,auVar57);
                    break;
                  case 6:
                    uVar2 = **(undefined4 **)(&this->field_0x118 + (long)p_Var14);
                    auVar52._4_4_ = uVar2;
                    auVar52._0_4_ = uVar2;
                    auVar52._8_4_ = uVar2;
                    auVar52._12_4_ = uVar2;
                    uVar2 = (*(undefined4 **)(&this->field_0x118 + (long)p_Var14))[1];
                    auVar67._4_4_ = uVar2;
                    auVar67._0_4_ = uVar2;
                    auVar67._8_4_ = uVar2;
                    auVar67._12_4_ = uVar2;
                    auVar57 = vfmadd213ps_fma(auVar153,auVar52,auVar67);
                    auVar57 = vmaxps_avx(auVar57,(undefined1  [16])0x0);
                    auVar95._8_4_ = 0x3f800000;
                    auVar95._0_8_ = 0x3f8000003f800000;
                    auVar95._12_4_ = 0x3f800000;
                    auVar57 = vminps_avx(auVar57,auVar95);
                    auVar153._0_4_ = auVar153._0_4_ * auVar57._0_4_;
                    auVar153._4_4_ = fVar22 * auVar57._4_4_;
                    auVar153._8_4_ = fVar37 * auVar57._8_4_;
                    auVar153._12_4_ = fVar157 * auVar57._12_4_;
                    auVar57 = vfmadd213ps_fma(auVar52,auVar164,auVar67);
                    auVar57 = vmaxps_avx(auVar57,(undefined1  [16])0x0);
                    auVar57 = vminps_avx(auVar57,auVar95);
                    auVar164._0_4_ = auVar164._0_4_ * auVar57._0_4_;
                    auVar164._4_4_ = fVar165 * auVar57._4_4_;
                    auVar164._8_4_ = fVar72 * auVar57._8_4_;
                    auVar164._12_4_ = fVar166 * auVar57._12_4_;
                  }
                  if (iVar34 < 0x65) {
                    *pauVar30 = auVar153;
                    pauVar30[1] = auVar164;
                    pauVar30 = pauVar30 + 2;
                  }
                  else {
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var14) +
                                      (long)local_2f0 * 0x20);
                    auVar53._0_4_ = auVar153._0_4_ * *pfVar1;
                    auVar53._4_4_ = auVar153._4_4_ * pfVar1[1];
                    auVar53._8_4_ = auVar153._8_4_ * pfVar1[2];
                    auVar53._12_4_ = auVar153._12_4_ * pfVar1[3];
                    pfVar1 = (float *)(*(long *)(&this->field_0x288 + (long)p_Var14) + 0x10 +
                                      (long)local_2f0 * 0x20);
                    auVar68._0_4_ = auVar164._0_4_ * *pfVar1;
                    auVar68._4_4_ = auVar164._4_4_ * pfVar1[1];
                    auVar68._8_4_ = auVar164._8_4_ * pfVar1[2];
                    auVar68._12_4_ = auVar164._12_4_ * pfVar1[3];
                    auVar90._8_4_ = 0x80000000;
                    auVar90._0_8_ = 0x8000000080000000;
                    auVar90._12_4_ = 0x80000000;
                    auVar57 = vandps_avx(auVar53,auVar90);
                    auVar81 = vandps_avx(auVar68,auVar90);
                    auVar139._8_4_ = 0x3f000000;
                    auVar139._0_8_ = 0x3f0000003f000000;
                    auVar139._12_4_ = 0x3f000000;
                    auVar57 = vorps_avx(auVar57,auVar139);
                    auVar81 = vorps_avx(auVar139,auVar81);
                    auVar54._0_4_ = (int)(auVar57._0_4_ + auVar53._0_4_);
                    auVar54._4_4_ = (int)(auVar57._4_4_ + auVar53._4_4_);
                    auVar54._8_4_ = (int)(auVar57._8_4_ + auVar53._8_4_);
                    auVar54._12_4_ = (int)(auVar57._12_4_ + auVar53._12_4_);
                    auVar69._0_4_ = (int)(auVar68._0_4_ + auVar81._0_4_);
                    auVar69._4_4_ = (int)(auVar68._4_4_ + auVar81._4_4_);
                    auVar69._8_4_ = (int)(auVar68._8_4_ + auVar81._8_4_);
                    auVar69._12_4_ = (int)(auVar68._12_4_ + auVar81._12_4_);
                    auVar91._8_2_ = 0x7f;
                    auVar91._0_8_ = 0x7f007f007f007f;
                    auVar91._10_2_ = 0x7f;
                    auVar91._12_2_ = 0x7f;
                    auVar91._14_2_ = 0x7f;
                    auVar57 = vpackssdw_avx(auVar54,auVar69);
                    auVar57 = vpminsw_avx(auVar57,auVar91);
                    auVar70._8_2_ = 0xff81;
                    auVar70._0_8_ = 0xff81ff81ff81ff81;
                    auVar70._10_2_ = 0xff81;
                    auVar70._12_2_ = 0xff81;
                    auVar70._14_2_ = 0xff81;
                    auVar57 = vpmaxsw_avx(auVar57,auVar70);
                    auVar57 = vpacksswb_avx(auVar57,auVar57);
                    *(long *)*pauVar26 = auVar57._0_8_;
                    pauVar26 = (undefined1 (*) [16])((long)*pauVar26 + 8);
                  }
                  bVar36 = iVar19 != iVar16;
                  iVar19 = iVar19 + 1;
                } while (bVar36);
              }
              pvVar11 = (void *)(ulong)(iVar21 + 1);
            } while (iVar21 != (int)local_298);
          }
          local_2f0 = (_func_int **)((long)local_2f0 + 1);
          local_300 = (ulong)(uint)((int)local_300 + iVar29);
        } while (local_2f0 != (_func_int **)local_1b8._0_8_);
      }
      if ((pointer)local_348._0_8_ != (pointer)0x0) {
        uVar35 = local_348._16_8_ - local_348._0_8_;
        pfVar24 = (pointer)local_348._0_8_;
LAB_00283569:
        operator_delete(pfVar24,uVar35);
      }
    }
    iVar18 = 0;
    goto LAB_0028365a;
  }
  sVar28 = 1;
  if ((*(uint *)(&this->field_0xd0 + (long)p_Var14) & 3) == 0) {
    sVar28 = (ulong)opt->use_packing_layout * 3 + 1;
  }
  iVar16 = (int)sVar28;
  uVar35 = (ulong)(uint)(iVar16 * 4);
  if (100 < *(int *)(&this->field_0x10c + (long)p_Var14)) {
    uVar35 = sVar28;
  }
  local_228._0_4_ = iVar29;
  local_218._0_8_ = sVar28;
  Mat::create(top_blob,iVar21,iVar29,(int)*(uint *)(&this->field_0xd0 + (long)p_Var14) / iVar16,
              uVar35,iVar16,opt->blob_allocator);
  auVar57 = local_218;
  auVar9 = stack0xfffffffffffffcd8;
  iVar18 = -100;
  if ((top_blob->data == (void *)0x0) || ((long)top_blob->c * top_blob->cstep == 0))
  goto LAB_0028365a;
  uVar20 = (int)uVar20 /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
  uVar13 = *(int *)(&this->field_0xd0 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]) /
           *(int *)(&this->field_0x108 + (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]);
  local_2f8 = (float *)CONCAT44(local_2f8._4_4_,uVar13);
  iVar16 = 1;
  _elempack = 1;
  if (opt->use_packing_layout == true) {
    iVar16 = 1;
    if ((uVar20 & 7) == 0) {
      iVar16 = 8;
    }
    _elempack = (uint)((uVar13 & 3) == 0) * 3 + 1;
  }
  piVar3 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
  local_348._12_4_ = local_288.refcount._4_4_;
  local_348._8_4_ = local_288.refcount._0_4_;
  local_348._0_8_ = local_288.data;
  local_348._16_8_ = local_288.elemsize;
  local_348._24_4_ = local_288.elempack;
  uStack_320._4_4_ = local_288.w;
  uStack_320._0_4_ = local_288.dims;
  uStack_318._4_4_ = local_288.d;
  uStack_318._0_4_ = local_288.h;
  local_348._32_8_ = local_288.allocator;
  uStack_30c = auVar9._28_4_;
  iStack_310 = local_288.c;
  local_308 = local_288.cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  if (iVar16 < iVar19) {
    local_2e8.data = *(void **)opt;
    local_2e8.elemsize = (size_t)opt->workspace_allocator;
    local_2e8.elempack = opt->openmp_blocktime;
    local_2e8._28_1_ = opt->use_winograd_convolution;
    local_2e8._29_1_ = opt->use_sgemm_convolution;
    local_2e8._30_1_ = opt->use_int8_inference;
    local_2e8._31_1_ = opt->use_vulkan_compute;
    local_2e8.allocator = *(Allocator **)&opt->use_bf16_storage;
    local_2e8._40_8_ = *(undefined8 *)&opt->use_shader_pack8;
    local_2e8._48_8_ = *(undefined8 *)&opt->flush_denormals;
    local_2e8._56_8_ = *(undefined8 *)&opt->use_reserved_4;
    local_2e8.refcount = (int *)opt->workspace_allocator;
    convert_packing(&local_288,(Mat *)local_348,iVar16,(Option *)&local_2e8);
  }
  piVar3 = top_blob->refcount;
  local_2e8.data = top_blob->data;
  local_2e8.refcount = top_blob->refcount;
  local_2e8.elemsize = top_blob->elemsize;
  local_2e8.elempack = top_blob->elempack;
  local_2e8.allocator = top_blob->allocator;
  local_2e8.dims = top_blob->dims;
  local_2e8.w = top_blob->w;
  local_2e8.h = top_blob->h;
  local_2e8.d = top_blob->d;
  local_2e8.c = top_blob->c;
  local_2e8.cstep = top_blob->cstep;
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + 1;
    UNLOCK();
  }
  pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx2;
  if (_elempack < auVar57._0_4_) {
    Mat::create(&local_2e8,iVar21,local_228._0_4_,
                *(int *)(&this->field_0xd0 + (long)pp_Var15[-3]) / (int)_elempack,
                (ulong)((byte)(((ushort)uVar35 & 0xff) / (ushort)auVar57[0]) * _elempack),_elempack,
                opt->workspace_allocator);
    iVar18 = -100;
    if ((local_2e8.data != (void *)0x0) && ((long)local_2e8.c * local_2e8.cstep != 0)) {
      pp_Var15 = this->_vptr_ConvolutionDepthWise_x86_avx2;
      goto LAB_002828cb;
    }
  }
  else {
LAB_002828cb:
    if (0 < *(int *)(&this->field_0x108 + (long)pp_Var15[-3])) {
      iVar21 = (int)local_2f8 / (int)_elempack;
      iVar29 = 0;
      iVar34 = 0;
      lVar27 = 0;
      do {
        if ((int)uStack_320 == 3) {
          local_1d8 = 3;
          lVar33 = (long)(int)uStack_318 * (long)uStack_320._4_4_ * local_348._16_8_;
          local_1cc = 1;
        }
        else {
          local_1d8 = 4;
          lVar33 = (long)(int)uStack_318 * (long)uStack_320._4_4_ *
                   (long)uStack_318._4_4_ * local_348._16_8_;
          local_1cc = uStack_318._4_4_;
        }
        local_200 = (pointer)((long)(iVar29 / iVar16) * local_308 * local_348._16_8_ +
                             local_348._0_8_);
        local_1d4 = uStack_320._4_4_;
        local_1e0 = (Allocator *)local_348._32_8_;
        local_1e8 = local_348._24_4_;
        local_1f8 = (int *)0x0;
        local_1f0 = (Allocator *)local_348._16_8_;
        local_1c0 = (lVar33 + 0xfU & 0xfffffffffffffff0) / (ulong)local_348._16_8_;
        local_1d0 = (int)uStack_318;
        if (local_2e8.dims == 3) {
          local_178 = 3;
          lVar33 = (long)local_2e8.h * (long)local_2e8.w * local_2e8.elemsize;
          local_16c = 1;
        }
        else {
          local_178 = 4;
          lVar33 = (long)local_2e8.h * (long)local_2e8.w * (long)local_2e8.d * local_2e8.elemsize;
          local_16c = local_2e8.d;
        }
        local_1a0 = (void *)((long)(iVar34 / (int)_elempack) * local_2e8.cstep * local_2e8.elemsize
                            + (long)local_2e8.data);
        local_174 = local_2e8.w;
        local_180 = local_2e8.allocator;
        local_188 = local_2e8.elempack;
        local_198 = (int *)0x0;
        local_190 = local_2e8.elemsize;
        local_160 = (lVar33 + 0xfU & 0xfffffffffffffff0) / local_2e8.elemsize;
        local_170 = local_2e8.h;
        pLVar4 = (this->group_ops).super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar27];
        local_78._0_1_ = opt->lightmode;
        local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
        local_78._4_4_ = opt->num_threads;
        pAStack_68 = opt->workspace_allocator;
        uStack_60._0_4_ = opt->openmp_blocktime;
        uStack_60._4_1_ = opt->use_winograd_convolution;
        uStack_60._5_1_ = opt->use_sgemm_convolution;
        uStack_60._6_1_ = opt->use_int8_inference;
        uStack_60._7_1_ = opt->use_vulkan_compute;
        local_58._0_1_ = opt->use_bf16_storage;
        local_58._1_1_ = opt->use_fp16_packed;
        local_58._2_1_ = opt->use_fp16_storage;
        local_58._3_1_ = opt->use_fp16_arithmetic;
        local_58._4_1_ = opt->use_int8_packed;
        local_58._5_1_ = opt->use_int8_storage;
        local_58._6_1_ = opt->use_int8_arithmetic;
        local_58._7_1_ = opt->use_packing_layout;
        uStack_50._0_1_ = opt->use_shader_pack8;
        uStack_50._1_1_ = opt->use_subgroup_basic;
        uStack_50._2_1_ = opt->use_subgroup_vote;
        uStack_50._3_1_ = opt->use_subgroup_ballot;
        uStack_50._4_1_ = opt->use_subgroup_shuffle;
        uStack_50._5_1_ = opt->use_image_storage;
        uStack_50._6_1_ = opt->use_tensor_storage;
        uStack_50._7_1_ = opt->use_weight_fp16_storage;
        uStack_48._0_4_ = opt->flush_denormals;
        uStack_48._4_1_ = opt->use_local_pool_allocator;
        uStack_48._5_1_ = opt->use_reserved_1;
        uStack_48._6_1_ = opt->use_reserved_2;
        uStack_48._7_1_ = opt->use_reserved_3;
        uStack_40._0_1_ = opt->use_reserved_4;
        uStack_40._1_1_ = opt->use_reserved_5;
        uStack_40._2_1_ = opt->use_reserved_6;
        uStack_40._3_1_ = opt->use_reserved_7;
        uStack_40._4_1_ = opt->use_reserved_8;
        uStack_40._5_1_ = opt->use_reserved_9;
        uStack_40._6_1_ = opt->use_reserved_10;
        uStack_40._7_1_ = opt->use_reserved_11;
        pAStack_70 = top_blob->allocator;
        local_1c8 = (int)uVar20 / iVar16;
        local_168 = iVar21;
        (*pLVar4->_vptr_Layer[7])(pLVar4,&local_200,&local_1a0,&local_78);
        if (local_198 != (int *)0x0) {
          LOCK();
          *local_198 = *local_198 + -1;
          UNLOCK();
          if (*local_198 == 0) {
            if (local_180 == (Allocator *)0x0) {
              if (local_1a0 != (void *)0x0) {
                free(local_1a0);
              }
            }
            else {
              (*local_180->_vptr_Allocator[3])();
            }
          }
        }
        if (local_1f8 != (int *)0x0) {
          LOCK();
          *local_1f8 = *local_1f8 + -1;
          UNLOCK();
          if (*local_1f8 == 0) {
            if (local_1e0 == (Allocator *)0x0) {
              if (local_200 != (pointer)0x0) {
                free(local_200);
              }
            }
            else {
              (*local_1e0->_vptr_Allocator[3])();
            }
          }
        }
        lVar27 = lVar27 + 1;
        iVar34 = iVar34 + (int)local_2f8;
        iVar29 = iVar29 + uVar20;
      } while (lVar27 < *(int *)(&this->field_0x108 +
                                (long)this->_vptr_ConvolutionDepthWise_x86_avx2[-3]));
    }
    if (_elempack < local_218._0_4_) {
      convert_packing(&local_2e8,top_blob,local_218._0_4_,opt);
      iVar18 = 0;
    }
    else {
      iVar18 = 0;
      if (&local_2e8 != top_blob) {
        if (local_2e8.refcount != (int *)0x0) {
          LOCK();
          *local_2e8.refcount = *local_2e8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        iVar18 = 0;
        top_blob->data = local_2e8.data;
        top_blob->refcount = local_2e8.refcount;
        top_blob->elemsize = local_2e8.elemsize;
        top_blob->elempack = local_2e8.elempack;
        top_blob->allocator = local_2e8.allocator;
        top_blob->dims = local_2e8.dims;
        top_blob->w = local_2e8.w;
        top_blob->h = local_2e8.h;
        top_blob->d = local_2e8.d;
        top_blob->c = local_2e8.c;
        top_blob->cstep = local_2e8.cstep;
      }
    }
  }
  if (local_2e8.refcount != (int *)0x0) {
    LOCK();
    *local_2e8.refcount = *local_2e8.refcount + -1;
    UNLOCK();
    if (*local_2e8.refcount == 0) {
      if (local_2e8.allocator == (Allocator *)0x0) {
        if (local_2e8.data != (void *)0x0) {
          free(local_2e8.data);
        }
      }
      else {
        (*(local_2e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if ((Allocator *)local_348._8_8_ != (Allocator *)0x0) {
    LOCK();
    *(int *)(_func_int ***)local_348._8_8_ = *(int *)(_func_int ***)local_348._8_8_ + -1;
    UNLOCK();
    if (*(int *)(_func_int ***)local_348._8_8_ == 0) {
      if ((Allocator *)local_348._32_8_ == (Allocator *)0x0) {
        if ((pointer)local_348._0_8_ != (pointer)0x0) {
          free((void *)local_348._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_348._32_8_)[3])();
      }
    }
  }
LAB_0028365a:
  piVar3 = (int *)CONCAT44(local_288.refcount._4_4_,local_288.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_288.allocator == (Allocator *)0x0) {
        if (local_288.data != (void *)0x0) {
          free(local_288.data);
        }
      }
      else {
        (*(local_288.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_128.refcount != (int *)0x0) {
    LOCK();
    *local_128.refcount = *local_128.refcount + -1;
    UNLOCK();
    if (*local_128.refcount == 0) {
      if (local_128.allocator == (Allocator *)0x0) {
        if (local_128.data != (void *)0x0) {
          free(local_128.data);
        }
      }
      else {
        (*(local_128.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar18;
}

Assistant:

int ConvolutionDepthWise_x86_avx2::forward_int8_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;

    int elembits = bottom_blob.elembits();

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    Mat bottom_blob_int8 = bottom_blob;
    if (elembits != 8)
    {
        const int channels_g = channels * elempack / group;

        Mat scales(channels * elempack);
        {
            float* ps = scales;
            for (int g = 0; g < group; g++)
            {
                float scale = bottom_blob_int8_scales[g];
                for (int q = 0; q < channels_g; q++)
                {
                    *ps++ = scale;
                }
            }
        }

        Option opt_q = opt;
        opt_q.blob_allocator = opt.workspace_allocator;
        quantize_to_int8(bottom_blob, bottom_blob_int8, scales, opt_q);
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob_int8, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;
    channels = bottom_blob_bordered.c;
    elempack = bottom_blob_bordered.elempack;

    int outw = (w - kernel_extent_w) / stride_w + 1;
    int outh = (h - kernel_extent_h) / stride_h + 1;

    // depth-wise
    if (channels * elempack == group && group == num_output)
    {
        int out_elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
            out_elempack = num_output % 8 == 0 ? 8 : 1;
        }
#endif // __SSE2__
        bool use_int8_requantize = int8_scale_term > 100;
        size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

        top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

#if __SSE2__
        if (elempack == 8)
        {
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < channels; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data_int8 + maxk * g * 8;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            __m128i _sum0 = _mm_setzero_si128();
                            __m128i _sum1 = _mm_setzero_si128();

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w * 8;

                            for (int k = 0; k < maxk; k++)
                            {
                                // TODO use _mm_cvtepi8_epi16 on sse4.1
                                __m128i _val = _mm_loadl_epi64((const __m128i*)(sptr + space_ofs[k] * 8));
                                _val = _mm_unpacklo_epi8(_val, _mm_cmpgt_epi8(_mm_setzero_si128(), _val));

                                __m128i _w = _mm_loadl_epi64((const __m128i*)(kptr + k * 8));
                                _w = _mm_unpacklo_epi8(_w, _mm_cmpgt_epi8(_mm_setzero_si128(), _w));

                                __m128i _sl = _mm_mullo_epi16(_val, _w);
                                __m128i _sh = _mm_mulhi_epi16(_val, _w);
                                __m128i _s0 = _mm_unpacklo_epi16(_sl, _sh);
                                __m128i _s1 = _mm_unpackhi_epi16(_sl, _sh);

                                _sum0 = _mm_add_epi32(_sum0, _s0);
                                _sum1 = _mm_add_epi32(_sum1, _s1);
                            }

                            __m128 _scale_in0;
                            __m128 _scale_in1;
                            {
                                __m128 _bottom_blob_int8_scales0 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8);
                                __m128 _bottom_blob_int8_scales1 = _mm_loadu_ps((const float*)bottom_blob_int8_scales + g * 8 + 4);
                                __m128 _weight_data_int8_scales0 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8);
                                __m128 _weight_data_int8_scales1 = _mm_loadu_ps((const float*)weight_data_int8_scales + g * 8 + 4);
                                _scale_in0 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales0, _weight_data_int8_scales0));
                                _scale_in1 = _mm_rcp_ps(_mm_mul_ps(_bottom_blob_int8_scales1, _weight_data_int8_scales1));

                                __m128 _m0 = _mm_cmpneq_ps(_weight_data_int8_scales0, _mm_setzero_ps());
                                __m128 _m1 = _mm_cmpneq_ps(_weight_data_int8_scales1, _mm_setzero_ps());
                                _scale_in0 = _mm_and_ps(_scale_in0, _m0);
                                _scale_in1 = _mm_and_ps(_scale_in1, _m1);
                            }

                            __m128 _sumfp32_0 = _mm_mul_ps(_mm_cvtepi32_ps(_sum0), _scale_in0);
                            __m128 _sumfp32_1 = _mm_mul_ps(_mm_cvtepi32_ps(_sum1), _scale_in1);

                            if (bias_term)
                            {
                                __m128 _bias0 = _mm_loadu_ps((const float*)bias_data + g * 8);
                                __m128 _bias1 = _mm_loadu_ps((const float*)bias_data + g * 8 + 4);
                                _sumfp32_0 = _mm_add_ps(_sumfp32_0, _bias0);
                                _sumfp32_1 = _mm_add_ps(_sumfp32_1, _bias1);
                            }

                            _sumfp32_0 = activation_sse(_sumfp32_0, activation_type, activation_params);
                            _sumfp32_1 = activation_sse(_sumfp32_1, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize and relu
                                __m128 _scale_out0 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8);
                                __m128 _scale_out1 = _mm_loadu_ps((const float*)top_blob_int8_scales + g * 8 + 4);
                                _sumfp32_0 = _mm_mul_ps(_sumfp32_0, _scale_out0);
                                _sumfp32_1 = _mm_mul_ps(_sumfp32_1, _scale_out1);
                                int64_t _sum8 = float2int8_sse(_sumfp32_0, _sumfp32_1);

                                *(int64_t*)outptr_s8 = _sum8;
                                outptr_s8 += 8;
                            }
                            else
                            {
                                // dequantize and relu
                                _mm_storeu_ps(outptr_f32, _sumfp32_0);
                                _mm_storeu_ps(outptr_f32 + 4, _sumfp32_1);
                                outptr_f32 += 8;
                            }
                        }
                    }
                }
            }
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            if (kernel_w == 3 && kernel_h == 3 && stride_w == 1 && stride_h == 1 && dilation_w == 1 && dilation_h == 1 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s1_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s1_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2 && (activation_type == 0 || activation_type == 1))
            {
                if (use_int8_requantize)
                {
                    std::vector<float> requantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float scale_in;
                        if (weight_data_int8_scales[g] == 0)
                            scale_in = 0;
                        else
                            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        float scale_out = top_blob_int8_scales[g];

                        requantize_scales.push_back(scale_in);
                        requantize_scales.push_back(scale_out);
                    }

                    convdw3x3s2_int8_requant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, requantize_scales, opt);
                }
                else
                {
                    std::vector<float> dequantize_scales;
                    for (int g = 0; g < group; g++)
                    {
                        float top_rescale = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                        dequantize_scales.push_back(top_rescale);
                    }

                    convdw3x3s2_int8_dequant_sse(bottom_blob_bordered, top_blob, weight_data, bias_data, dequantize_scales, opt);
                }

                if (activation)
                {
                    activation->forward_inplace(top_blob, opt);
                }
            }
            else
            {
                const int maxk = kernel_w * kernel_h;

                // kernel offsets
                std::vector<int> _space_ofs(maxk);
                int* space_ofs = &_space_ofs[0];
                {
                    int p1 = 0;
                    int p2 = 0;
                    int gap = w * dilation_h - kernel_w * dilation_w;
                    for (int i = 0; i < kernel_h; i++)
                    {
                        for (int j = 0; j < kernel_w; j++)
                        {
                            space_ofs[p1] = p2;
                            p1++;
                            p2 += dilation_w;
                        }
                        p2 += gap;
                    }
                }

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int g = 0; g < group; g++)
                {
                    signed char* outptr_s8 = top_blob.channel(g);
                    float* outptr_f32 = top_blob.channel(g);
                    const signed char* kptr = (const signed char*)weight_data + maxk * g;
                    const Mat m = bottom_blob_bordered.channel(g);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            int sum = 0;

                            const signed char* sptr = m.row<const signed char>(i * stride_h) + j * stride_w;

                            for (int k = 0; k < maxk; k++)
                            {
                                signed char val = sptr[space_ofs[k]];
                                signed char w = kptr[k];
                                sum += val * w;
                            }

                            float scale_in;
                            if (weight_data_int8_scales[g] == 0)
                                scale_in = 0;
                            else
                                scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);

                            float sumfp32 = sum * scale_in;

                            if (bias_term)
                                sumfp32 += bias_data[g];

                            sumfp32 = activation_ss(sumfp32, activation_type, activation_params);

                            if (use_int8_requantize)
                            {
                                // requantize
                                float scale_out = top_blob_int8_scales[g];
                                signed char sums8 = float2int8(sumfp32 * scale_out);
                                outptr_s8[0] = sums8;
                                outptr_s8 += 1;
                            }
                            else
                            {
                                // dequantize
                                outptr_f32[0] = sumfp32;
                                outptr_f32 += 1;
                            }
                        }
                    }
                }
            }
        }

        return 0;
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        out_elempack = num_output % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__
    bool use_int8_requantize = int8_scale_term > 100;
    size_t out_elemsize = use_int8_requantize ? 1u * out_elempack : 4u * out_elempack;

    top_blob.create(outw, outh, num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // group convolution
    const int channels_g = channels * elempack / group;
    const int num_output_g = num_output / group;

    int g_elempack = 1;
    int out_g_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        g_elempack = channels_g % 8 == 0 ? 8 : 1;
        out_g_elempack = num_output_g % 4 == 0 ? 4 : 1;
    }
#endif // __SSE2__

    // unpacking
    Mat bottom_blob_bordered_unpacked = bottom_blob_bordered;
    if (elempack > g_elempack)
    {
        Option opt_p = opt;
        opt_p.blob_allocator = opt.workspace_allocator;
        convert_packing(bottom_blob_bordered, bottom_blob_bordered_unpacked, g_elempack, opt_p);
    }

    Mat top_blob_unpacked = top_blob;
    if (out_g_elempack < out_elempack)
    {
        top_blob_unpacked.create(outw, outh, num_output / out_g_elempack, out_elemsize / out_elempack * out_g_elempack, out_g_elempack, opt.workspace_allocator);
        if (top_blob_unpacked.empty())
            return -100;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int g = 0; g < group; g++)
    {
        const Mat bottom_blob_bordered_g = bottom_blob_bordered_unpacked.channel_range(channels_g * g / g_elempack, channels_g / g_elempack);
        Mat top_blob_g = top_blob_unpacked.channel_range(num_output_g * g / out_g_elempack, num_output_g / out_g_elempack);

        const ncnn::Layer* op = group_ops[g];

        Option opt_g = opt;
        opt_g.blob_allocator = top_blob.allocator;

        // forward
        op->forward(bottom_blob_bordered_g, top_blob_g, opt_g);
    }

    // packing
    if (out_g_elempack < out_elempack)
    {
        convert_packing(top_blob_unpacked, top_blob, out_elempack, opt);
    }
    else
    {
        top_blob = top_blob_unpacked;
    }

    return 0;
}